

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

long __thiscall
mkvparser::ContentEncoding::ParseContentEncAESSettingsEntry
          (ContentEncoding *this,longlong start,longlong size,IMkvReader *pReader,
          ContentEncAESSettings *aes)

{
  long lVar1;
  longlong lVar2;
  long lVar3;
  unsigned_long_long uVar4;
  long stop;
  longlong pos;
  longlong size_1;
  longlong id;
  long local_50;
  ContentEncAESSettings *local_48;
  longlong local_40;
  long local_38;
  
  if (pReader == (IMkvReader *)0x0) {
    __assert_fail("pReader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x104f,
                  "long mkvparser::ContentEncoding::ParseContentEncAESSettingsEntry(long long, long long, IMkvReader *, ContentEncAESSettings *)"
                 );
  }
  local_48 = aes;
  if (aes == (ContentEncAESSettings *)0x0) {
    __assert_fail("aes",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1050,
                  "long mkvparser::ContentEncoding::ParseContentEncAESSettingsEntry(long long, long long, IMkvReader *, ContentEncAESSettings *)"
                 );
  }
  stop = size + start;
  local_50 = start;
  do {
    if (stop <= local_50) {
      return 0;
    }
    lVar3 = ParseElementHeader(pReader,&local_50,stop,&local_38,&local_40);
    lVar2 = local_40;
    lVar1 = local_50;
    if (lVar3 < 0) {
      return lVar3;
    }
    if (local_38 == 0x47e8) {
      uVar4 = UnserializeUInt(pReader,local_50,local_40);
      local_48->cipher_mode = uVar4;
      if (uVar4 != 1) {
        return -2;
      }
    }
    local_50 = lVar1 + lVar2;
  } while (local_50 <= stop);
  return -2;
}

Assistant:

long ContentEncoding::ParseContentEncAESSettingsEntry(
    long long start, long long size, IMkvReader* pReader,
    ContentEncAESSettings* aes) {
  assert(pReader);
  assert(aes);

  long long pos = start;
  const long long stop = start + size;

  while (pos < stop) {
    long long id, size;
    const long status = ParseElementHeader(pReader, pos, stop, id, size);
    if (status < 0)  // error
      return status;

    if (id == libwebm::kMkvAESSettingsCipherMode) {
      aes->cipher_mode = UnserializeUInt(pReader, pos, size);
      if (aes->cipher_mode != 1)
        return E_FILE_FORMAT_INVALID;
    }

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  return 0;
}